

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

archive_string_conv * get_sconv_object(archive_conflict *a,char *fc,char *tc,wchar_t flag)

{
  archive_string_conv *paVar1;
  int iVar2;
  char *__s;
  char *__s_00;
  archive_string_conv *paVar3;
  char *__ptr;
  char *pcVar4;
  iconv_t pvVar5;
  wchar_t wVar6;
  archive_string_conv *paVar7;
  uint uVar8;
  wchar_t wVar9;
  
  if (a == (archive_conflict *)0x0) {
    paVar3 = (archive_string_conv *)0x0;
  }
  else {
    paVar3 = a->sconv;
    while ((paVar3 != (archive_string_conv *)0x0 &&
           ((iVar2 = strcmp(paVar3->from_charset,fc), iVar2 != 0 ||
            (iVar2 = strcmp(paVar3->to_charset,tc), iVar2 != 0))))) {
      paVar3 = paVar3->next;
    }
  }
  if (paVar3 != (archive_string_conv *)0x0) {
    return paVar3;
  }
  if (a == (archive_conflict *)0x0) {
    uVar8 = 0xffffffff;
  }
  else {
    uVar8 = a->current_codepage;
  }
  __s = canonical_charset_name(fc);
  __s_00 = canonical_charset_name(tc);
  paVar3 = (archive_string_conv *)calloc(1,0x68);
  if (paVar3 != (archive_string_conv *)0x0) {
    paVar3->next = (archive_string_conv *)0x0;
    __ptr = strdup(__s);
    paVar3->from_charset = __ptr;
    if (__ptr != (char *)0x0) {
      pcVar4 = strdup(__s_00);
      paVar3->to_charset = pcVar4;
      if (pcVar4 != (char *)0x0) {
        (paVar3->utftmp).s = (char *)0x0;
        (paVar3->utftmp).length = 0;
        (paVar3->utftmp).buffer_length = 0;
        if ((flag & 1U) == 0) {
          if ((flag & 2U) != 0) {
            paVar3->to_cp = uVar8;
            paVar3->from_cp = 0xffffffff;
          }
        }
        else {
          paVar3->from_cp = uVar8;
          paVar3->to_cp = 0xffffffff;
        }
        iVar2 = strcmp(__s,__s_00);
        wVar6 = L'\x01';
        if ((iVar2 != 0) && ((paVar3->from_cp == 0xffffffff || (paVar3->from_cp != paVar3->to_cp))))
        {
          wVar6 = L'\0';
        }
        paVar3->same = wVar6;
        iVar2 = strcmp(__s_00,"UTF-8");
        if (iVar2 == 0) {
          wVar6 = flag | 0x100;
        }
        else {
          iVar2 = strcmp(__s_00,"UTF-16BE");
          if (iVar2 == 0) {
            wVar6 = flag | 0x400;
          }
          else {
            iVar2 = strcmp(__s_00,"UTF-16LE");
            wVar6 = flag | 0x1000;
            if (iVar2 != 0) {
              wVar6 = flag;
            }
          }
        }
        iVar2 = strcmp(__s,"UTF-8");
        if (iVar2 == 0) {
          wVar6 = wVar6 | 0x200;
        }
        else {
          iVar2 = strcmp(__s,"UTF-16BE");
          if (iVar2 == 0) {
            wVar6 = wVar6 | 0x800;
          }
          else {
            iVar2 = strcmp(__s,"UTF-16LE");
            if (iVar2 == 0) {
              wVar6 = wVar6 | 0x2000;
            }
          }
        }
        wVar9 = wVar6 | 0x40;
        if ((wVar6 & 0x2a00U) == 0) {
          wVar9 = wVar6;
        }
        if ((wVar6 & 2U) == 0) {
          wVar9 = wVar6;
        }
        paVar3->cd_w = (iconv_t)0xffffffffffffffff;
        if (((wVar9 & 8U) == 0) && ((wVar9 & 0x1500U) == 0 || (wVar9 & 0x2a00U) == 0)) {
          pvVar5 = iconv_open(__s_00,__s);
          paVar3->cd = pvVar5;
          if ((pvVar5 == (iconv_t)0xffffffffffffffff) && ((paVar3->flag & L'\x04') != L'\0')) {
            iVar2 = strcmp(__s_00,"CP932");
            if (iVar2 == 0) {
              __s_00 = "SJIS";
            }
            else {
              iVar2 = strcmp(__s,"CP932");
              if (iVar2 != 0) goto LAB_00157b5e;
              __s = "SJIS";
            }
            pvVar5 = iconv_open(__s_00,__s);
            paVar3->cd = pvVar5;
          }
        }
        else {
          paVar3->cd = (iconv_t)0xffffffffffffffff;
        }
LAB_00157b5e:
        paVar3->flag = wVar9;
        setup_converter(paVar3);
        goto LAB_00157b6a;
      }
      free(__ptr);
    }
    free(paVar3);
  }
  paVar3 = (archive_string_conv *)0x0;
LAB_00157b6a:
  if (paVar3 == (archive_string_conv *)0x0) {
    if (a != (archive_conflict *)0x0) {
      archive_set_error((archive *)a,0xc,"Could not allocate memory for a string conversion object")
      ;
      return (archive_string_conv *)0x0;
    }
  }
  else {
    if (paVar3->nconverter != L'\0') {
      if (a == (archive_conflict *)0x0) {
        return paVar3;
      }
      paVar1 = (archive_string_conv *)&a->sconv;
      do {
        paVar7 = paVar1;
        paVar1 = paVar7->next;
      } while (paVar1 != (archive_string_conv *)0x0);
      paVar7->next = paVar3;
      return paVar3;
    }
    if (a != (archive_conflict *)0x0) {
      if ((flag & 1U) == 0) {
        tc = fc;
      }
      archive_set_error((archive *)a,-1,"iconv_open failed : Cannot handle ``%s\'\'",tc);
    }
    free_sconv_object(paVar3);
  }
  return (archive_string_conv *)0x0;
}

Assistant:

static struct archive_string_conv *
get_sconv_object(struct archive *a, const char *fc, const char *tc, int flag)
{
	struct archive_string_conv *sc;
	unsigned current_codepage;

	/* Check if we have made the sconv object. */
	sc = find_sconv_object(a, fc, tc);
	if (sc != NULL)
		return (sc);

	if (a == NULL)
		current_codepage = get_current_codepage();
	else
		current_codepage = a->current_codepage;

	sc = create_sconv_object(canonical_charset_name(fc),
	    canonical_charset_name(tc), current_codepage, flag);
	if (sc == NULL) {
		if (a != NULL)
			archive_set_error(a, ENOMEM,
			    "Could not allocate memory for "
			    "a string conversion object");
		return (NULL);
	}

	/*
	 * If there is no converter for current string conversion object,
	 * we cannot handle this conversion.
	 */
	if (sc->nconverter == 0) {
		if (a != NULL) {
#if HAVE_ICONV
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "iconv_open failed : Cannot handle ``%s''",
			    (flag & SCONV_TO_CHARSET)?tc:fc);
#else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "A character-set conversion not fully supported "
			    "on this platform");
#endif
		}
		/* Failed; free a sconv object. */
		free_sconv_object(sc);
		return (NULL);
	}

	/*
	 * Success!
	 */
	if (a != NULL)
		add_sconv_object(a, sc);
	return (sc);
}